

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkMap.c
# Opt level: O1

If_Obj_t * Lpk_MapPrimeInternal(If_Man_t *pIfMan,Kit_Graph_t *pGraph)

{
  uint uVar1;
  Kit_Node_t *pKVar2;
  long lVar3;
  uint uVar4;
  If_Obj_t *pIVar5;
  undefined1 *puVar6;
  anon_union_8_2_00c7e208_for_Kit_Node_t__2 *paVar7;
  long lVar8;
  long lVar9;
  
  if (pGraph->fConst == 0) {
    uVar4 = (uint)pGraph->eRoot >> 1 & 0x3fffffff;
    uVar1 = pGraph->nLeaves;
    lVar9 = (long)(int)uVar1;
    if (uVar4 < uVar1) {
      paVar7 = &pGraph->pNodes[uVar4].field_2;
    }
    else {
      if ((int)uVar1 < pGraph->nSize) {
        lVar3 = lVar9 * 0x18 + -0x18;
        do {
          lVar8 = lVar3;
          pKVar2 = pGraph->pNodes;
          uVar1 = *(uint *)(&pKVar2[1].eEdge0.field_0x0 + lVar8);
          uVar4 = *(uint *)(&pKVar2[1].eEdge1.field_0x0 + lVar8);
          pIVar5 = If_ManCreateAnd(pIfMan,(If_Obj_t *)
                                          ((ulong)((pKVar2[uVar1 >> 1 & 0x3fffffff].field_2.iFunc ^
                                                   uVar1) & 1) |
                                          (ulong)pKVar2[uVar1 >> 1 & 0x3fffffff].field_2.pFunc &
                                          0xfffffffffffffffe),
                                   (If_Obj_t *)
                                   ((ulong)((pKVar2[uVar4 >> 1 & 0x3fffffff].field_2.iFunc ^ uVar4)
                                           & 1) |
                                   (ulong)pKVar2[uVar4 >> 1 & 0x3fffffff].field_2.pFunc &
                                   0xfffffffffffffffe));
          *(If_Obj_t **)((long)&pKVar2[1].field_2 + lVar8) = pIVar5;
          lVar9 = lVar9 + 1;
          lVar3 = lVar8 + 0x18;
        } while (lVar9 < pGraph->nSize);
        puVar6 = &pKVar2[1].eEdge0.field_0x0 + lVar8;
      }
      else {
        puVar6 = (undefined1 *)0x0;
      }
      paVar7 = (anon_union_8_2_00c7e208_for_Kit_Node_t__2 *)(puVar6 + 8);
    }
  }
  else {
    paVar7 = (anon_union_8_2_00c7e208_for_Kit_Node_t__2 *)&pIfMan->pConst1;
  }
  return (If_Obj_t *)paVar7->pFunc;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Transforms the decomposition graph into the AIG.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
If_Obj_t * Lpk_MapPrimeInternal( If_Man_t * pIfMan, Kit_Graph_t * pGraph )
{
    Kit_Node_t * pNode = NULL; // Suppress "might be used uninitialized"
    If_Obj_t * pAnd0, * pAnd1;
    int i;
    // check for constant function
    if ( Kit_GraphIsConst(pGraph) )
        return If_ManConst1(pIfMan);
    // check for a literal
    if ( Kit_GraphIsVar(pGraph) )
        return (If_Obj_t *)Kit_GraphVar(pGraph)->pFunc;
    // build the AIG nodes corresponding to the AND gates of the graph
    Kit_GraphForEachNode( pGraph, pNode, i )
    {
        pAnd0 = (If_Obj_t *)Kit_GraphNode(pGraph, pNode->eEdge0.Node)->pFunc; 
        pAnd1 = (If_Obj_t *)Kit_GraphNode(pGraph, pNode->eEdge1.Node)->pFunc; 
        pNode->pFunc = If_ManCreateAnd( pIfMan, 
            If_NotCond( If_Regular(pAnd0), If_IsComplement(pAnd0) ^ pNode->eEdge0.fCompl ), 
            If_NotCond( If_Regular(pAnd1), If_IsComplement(pAnd1) ^ pNode->eEdge1.fCompl ) );
    }
    return (If_Obj_t *)pNode->pFunc;
}